

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O0

float duy(qnode_ptr_t p,int x,int y)

{
  int h_00;
  int iVar1;
  int local_24;
  int h;
  int j;
  int i;
  float d;
  int y_local;
  int x_local;
  qnode_ptr_t p_local;
  
  h_00 = Ix.m / 2;
  j = 0;
  iVar1 = overflow(x,y,p->sizy,p->sizx,p->ofst,h_00,3);
  if (iVar1 == 0) {
    for (h = -h_00; h <= h_00; h = h + 1) {
      for (local_24 = -h_00; local_24 <= h_00; local_24 = local_24 + 1) {
        j = (int)((*p->flow_ptr)[p->res * (x + h) + y + local_24].x *
                  Ix.g[local_24 + h_00][h + h_00] + (float)j);
      }
    }
  }
  return (float)j / Ix.f;
}

Assistant:

float duy(p,x,y)
qnode_ptr_t p ;
int x, y ;

{ extern beaudet_t Ix ;
  float d ;
  int i, j, h ;

  h = Ix.m/2 ;
  d = 0.0 ;

  if (!overflow(x,y,p->sizy,p->sizx,p->ofst,h,3)) {
    for (i = -h ; i <= h ; i++) {
      for (j = -h ; j <= h ; j++) {
        d = d + (*p->flow_ptr)[p->res*(x+i) + y+j].x*Ix.g[j+h][i+h] ;
      }
    }
  }
  return(d/Ix.f) ;
}